

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fast-dtoa.cc
# Opt level: O1

void TestFastDtoaGayShortestSingle(void)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  PrecomputedShortestSingle *pPVar5;
  bool bVar6;
  char *pcVar7;
  uint uVar8;
  undefined8 uVar9;
  long lVar10;
  bool bVar11;
  Vector<const_double_conversion::PrecomputedShortestSingle> VVar12;
  Vector<char> buffer;
  int point;
  int length;
  char buffer_container [100];
  int *in_stack_ffffffffffffff48;
  uint local_a0;
  int local_9c;
  char local_98 [104];
  
  VVar12 = double_conversion::PrecomputedShortestSingleRepresentations();
  pPVar5 = VVar12.start_;
  bVar6 = false;
  uVar8 = VVar12.length_;
  if ((int)uVar8 < 1) {
    bVar11 = false;
  }
  else {
    iVar4 = 0;
    lVar10 = 0;
    bVar11 = false;
    bVar6 = false;
    do {
      pcVar7 = *(char **)((long)&pPVar5->representation + lVar10);
      uVar1 = *(uint *)((long)&pPVar5->decimal_point + lVar10);
      buffer._8_8_ = &local_9c;
      buffer.start_ = (char *)0x64;
      bVar2 = double_conversion::FastDtoa
                        ((double_conversion *)0x1,(double)*(float *)((long)&pPVar5->v + lVar10),
                         FAST_DTOA_SHORTEST,(int)local_98,buffer,(int *)&local_a0,
                         in_stack_ffffffffffffff48);
      if (9 < local_9c) {
        pcVar7 = "kFastDtoaMaximalSingleLength >= length";
        uVar9 = 0x15c;
        goto LAB_00863f94;
      }
      if (bVar2) {
        bVar6 = bVar11;
        if (local_9c == 9) {
          bVar6 = true;
        }
        if (uVar1 != local_a0) {
          printf("%s:%d:\n CHECK_EQ(%s, %s) failed\n#  Expected: %d\n#  Found:    %d\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/mmp[P]pbrt-v4/src/ext/double-conversion/test/cctest/test-fast-dtoa.cc"
                 ,0x160,"current_test.decimal_point","point",(ulong)uVar1,
                 CONCAT44((int)((ulong)in_stack_ffffffffffffff48 >> 0x20),local_a0));
LAB_00863fce:
          abort();
        }
        if (pcVar7 == (char *)0x0) goto LAB_00863fce;
        iVar3 = strcmp(pcVar7,local_98);
        if (iVar3 != 0) {
          printf("%s:%d:\n CHECK_EQ(%s, %s) failed\n#  Expected: %s\n#  Found:    %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/mmp[P]pbrt-v4/src/ext/double-conversion/test/cctest/test-fast-dtoa.cc"
                 ,0x161,"current_test.representation","buffer.start()",pcVar7,local_98);
          abort();
        }
        iVar4 = iVar4 + 1;
        bVar11 = bVar6;
      }
      lVar10 = lVar10 + 0x18;
    } while ((ulong)uVar8 * 0x18 != lVar10);
    bVar11 = 0.98 < (double)iVar4 / (double)(int)uVar8;
  }
  if (bVar11) {
    if (bVar6) {
      return;
    }
    pcVar7 = "needed_max_length";
    uVar9 = 0x164;
  }
  else {
    pcVar7 = "succeeded*1.0/total > 0.98";
    uVar9 = 0x163;
  }
LAB_00863f94:
  printf("%s:%d:\n CHECK(%s) failed\n",
         "/workspace/llm4binary/github/license_c_cmakelists/mmp[P]pbrt-v4/src/ext/double-conversion/test/cctest/test-fast-dtoa.cc"
         ,uVar9,pcVar7);
  abort();
}

Assistant:

TEST(FastDtoaGayShortestSingle) {
  char buffer_container[kBufferSize];
  Vector<char> buffer(buffer_container, kBufferSize);
  bool status;
  int length;
  int point;
  int succeeded = 0;
  int total = 0;
  bool needed_max_length = false;

  Vector<const PrecomputedShortestSingle> precomputed =
      PrecomputedShortestSingleRepresentations();
  for (int i = 0; i < precomputed.length(); ++i) {
    const PrecomputedShortestSingle current_test = precomputed[i];
    total++;
    float v = current_test.v;
    status = FastDtoa(v, FAST_DTOA_SHORTEST_SINGLE, 0, buffer, &length, &point);
    CHECK(kFastDtoaMaximalSingleLength >= length);
    if (!status) continue;
    if (length == kFastDtoaMaximalSingleLength) needed_max_length = true;
    succeeded++;
    CHECK_EQ(current_test.decimal_point, point);
    CHECK_EQ(current_test.representation, buffer.start());
  }
  CHECK(succeeded*1.0/total > 0.98);
  CHECK(needed_max_length);
}